

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cpp
# Opt level: O2

ostream * operator<<(ostream *os,total_game_stats_t *s)

{
  ostream *poVar1;
  
  poVar1 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)os);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,s->gameCount);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,s->winCount);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar1);
  std::operator<<(poVar1,"\n");
  std::ostream::_M_insert<double>(s->totalDuration);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, total_game_stats_t &s) {
  os << s.bestScore << "\n"
     << s.gameCount << "\n"
     << s.winCount << "\n"
     << s.totalMoveCount << "\n"
     << s.totalDuration;
  return os;
}